

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry_impl.hpp
# Opt level: O2

bean_ptr<A> * hiberlite::Registry<A>::get(bean_ptr<A> *__return_storage_ptr__,bean_key *key)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  shared_res<hiberlite::autoclosed_con> *this;
  bean_key local_50;
  bean_key local_38;
  
  iVar2 = std::
          _Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
          ::find((_Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
                  *)rbpairs,key);
  if (iVar2._M_node == (_Base_ptr)(rbpairs + 8)) {
    bean_key::bean_key(&local_50,key);
    createBeanPtr(__return_storage_ptr__,&local_50,(A *)0x0);
    this = &local_50.con;
  }
  else {
    this = &local_38.con;
    bean_key::bean_key(&local_38,key);
    p_Var1 = iVar2._M_node[1]._M_right;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<A>_>)._vptr_shared_res =
         (_func_int **)&PTR__shared_res_001bb5c8;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<A>_>).res =
         (shared_cnt_obj_pair<hiberlite::real_bean<A>_> *)p_Var1;
    if (p_Var1 != (_Base_ptr)0x0) {
      *(int *)&p_Var1->_M_left = *(int *)&p_Var1->_M_left + 1;
    }
  }
  shared_res<hiberlite::autoclosed_con>::~shared_res(this);
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Registry<C>::get(const bean_key key)
{
	typename std::map<bean_key,rb_pair<C>* >::iterator it;
	it=rbpairs.find(key);
	if(it==rbpairs.end())
		return createBeanPtr(key,NULL);
	else
		return bean_ptr<C>(key, it->second);
}